

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

void __thiscall
helics::FederateState::processDataConnectionMessage(FederateState *this,ActionMessage *cmd)

{
  ushort uVar1;
  action_t aVar2;
  BaseType BVar3;
  size_t sVar4;
  pointer pcVar5;
  size_type sVar6;
  GlobalHandle subscriberToRemove;
  GlobalHandle sourceToRemove;
  GlobalHandle dest;
  GlobalHandle newSubscriber;
  byte *pbVar7;
  GlobalHandle source;
  string_view sunits;
  bool bVar8;
  InputInfo *pIVar9;
  string *psVar10;
  PublicationInfo *pPVar11;
  EndpointInfo *pEVar12;
  code *UNRECOVERED_JUMPTABLE;
  Time TVar13;
  TimeCoordinator *pTVar14;
  string_view sourceName;
  string_view sourceName_00;
  string_view sourceName_01;
  string_view subscriberName;
  string_view sourceName_02;
  string_view destName;
  string_view stype;
  string_view sourceType;
  string_view sourceType_00;
  string_view destType;
  allocator<char> local_119;
  byte *local_118;
  GlobalHandle local_110;
  size_t local_108;
  char *pcStack_100;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  ActionMessage pub;
  
  aVar2 = cmd->messageAction;
  if (aVar2 == cmd_remove_publication) {
    pIVar9 = InterfaceInfo::getInput
                       (&this->interfaceInformation,(InterfaceHandle)(cmd->dest_handle).hid);
    if (pIVar9 != (InputInfo *)0x0) {
      sourceToRemove.fed_id.gid = (cmd->source_id).gid;
      sourceToRemove.handle.hid = (cmd->source_handle).hid;
      TVar13.internalTimeCode = (cmd->actionTime).internalTimeCode;
      if (TVar13.internalTimeCode == 0) {
        TVar13.internalTimeCode = (this->time_granted).internalTimeCode;
      }
      InputInfo::removeSource(pIVar9,sourceToRemove,TVar13);
      return;
    }
  }
  else if (aVar2 == cmd_add_subscriber) {
    pPVar11 = InterfaceInfo::getPublication
                        (&this->interfaceInformation,(InterfaceHandle)(cmd->dest_handle).hid);
    if (pPVar11 != (PublicationInfo *)0x0) {
      newSubscriber.fed_id.gid = (cmd->source_id).gid;
      newSubscriber.handle.hid = (cmd->source_handle).hid;
      subscriberName._M_str = (char *)(cmd->payload).heap;
      subscriberName._M_len = (cmd->payload).bufferSize;
      bVar8 = PublicationInfo::addSubscriber(pPVar11,newSubscriber,subscriberName);
      if ((bVar8) && (this->timeMethod == DISTRIBUTED)) {
        pTVar14 = (this->timeCoord)._M_t.
                  super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                  .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
        (**(code **)((long)(pTVar14->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator + 0x28))
                  (pTVar14,(cmd->source_id).gid);
      }
      if ((this->state)._M_i != CREATED) {
        if (((this->state)._M_i == EXECUTING) && (this->timeMethod == DISTRIBUTED)) {
          pTVar14 = (this->timeCoord)._M_t.
                    super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                    .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
          (**(code **)((long)(pTVar14->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator + 0x40))
                    (pTVar14,(cmd->source_id).gid);
          pTVar14 = (this->timeCoord)._M_t.
                    super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                    .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
          (**(code **)((long)(pTVar14->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator + 0x28))
                    (pTVar14,(cmd->source_id).gid);
        }
        if (((pPVar11->data).bufferSize != 0) &&
           (-0x7fffffffffffffff < (pPVar11->lastPublishTime).internalTimeCode)) {
          ActionMessage::ActionMessage(&pub,cmd_pub);
          pub._8_8_ = pPVar11->id;
          pub.dest_id.gid = (cmd->source_id).gid;
          pub.dest_handle.hid = (cmd->source_handle).hid;
          pub.counter = (uint16_t)
                        (((this->timeCoord)._M_t.
                          super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                          .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl)->
                        iteration).super___atomic_base<int>._M_i;
          SmallBuffer::operator=(&pub.payload,&pPVar11->data);
          pub.actionTime.internalTimeCode = (pPVar11->lastPublishTime).internalTimeCode;
          routeMessage(this,&pub);
          ActionMessage::~ActionMessage(&pub);
        }
      }
    }
  }
  else if (aVar2 == cmd_add_endpoint) {
    pEVar12 = InterfaceInfo::getEndpoint
                        (&this->interfaceInformation,(InterfaceHandle)(cmd->dest_handle).hid);
    if (pEVar12 != (EndpointInfo *)0x0) {
      uVar1 = cmd->flags;
      local_118 = (cmd->payload).heap;
      dest.fed_id.gid = (cmd->source_id).gid;
      dest.handle.hid = (cmd->source_handle).hid;
      sVar4 = (cmd->payload).bufferSize;
      psVar10 = ActionMessage::getString_abi_cxx11_(cmd,0);
      pcVar5 = (psVar10->_M_dataplus)._M_p;
      if ((uVar1 & 2) == 0) {
        sourceName_01._M_str = (char *)local_118;
        sourceName_01._M_len = sVar4;
        sourceType._M_str = pcVar5;
        sourceType._M_len = psVar10->_M_string_length;
        EndpointInfo::addSource(pEVar12,dest,sourceName_01,sourceType);
        if (((pEVar12->targetedEndpoint == true) && (this->timeMethod == DISTRIBUTED)) &&
           (pTVar14 = (this->timeCoord)._M_t.
                      super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                      .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl,
           (**(code **)((long)(pTVar14->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator + 0x20)
           )(pTVar14,(cmd->source_id).gid), (this->state)._M_i == EXECUTING)) {
          (this->minimumReceiveTime).internalTimeCode = (this->time_granted).internalTimeCode;
        }
      }
      else {
        destName._M_str = (char *)local_118;
        destName._M_len = sVar4;
        destType._M_str = pcVar5;
        destType._M_len = psVar10->_M_string_length;
        EndpointInfo::addDestination(pEVar12,dest,destName,destType);
        if ((pEVar12->targetedEndpoint == true) && (this->timeMethod == DISTRIBUTED)) {
          BVar3 = (cmd->source_id).gid;
          pTVar14 = (this->timeCoord)._M_t.
                    super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                    .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
          UNRECOVERED_JUMPTABLE =
               *(code **)((long)(pTVar14->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator +
                         0x28);
LAB_002b5405:
          (*UNRECOVERED_JUMPTABLE)(pTVar14,BVar3);
          return;
        }
      }
    }
  }
  else if (aVar2 == cmd_remove_named_publication) {
    pIVar9 = InterfaceInfo::getInput
                       (&this->interfaceInformation,(InterfaceHandle)(cmd->source_handle).hid);
    if (pIVar9 != (InputInfo *)0x0) {
      local_f8._M_len = (cmd->payload).bufferSize;
      local_f8._M_str = (char *)(cmd->payload).heap;
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&pub,&local_f8,&local_119);
      TVar13.internalTimeCode = (cmd->actionTime).internalTimeCode;
      if (TVar13.internalTimeCode == 0) {
        TVar13.internalTimeCode = (this->time_granted).internalTimeCode;
      }
      sourceName._M_str = (char *)pub._0_8_;
      sourceName._M_len._0_4_ = pub.source_id.gid;
      sourceName._M_len._4_4_ = pub.source_handle.hid;
      InputInfo::removeSource(pIVar9,sourceName,TVar13);
      std::__cxx11::string::~string((string *)&pub);
    }
  }
  else if (aVar2 == cmd_close_interface) {
    if ((cmd->source_id).gid == (this->global_id)._M_i.gid) {
      closeInterface(this,(InterfaceHandle)(cmd->source_handle).hid,(InterfaceType)cmd->counter);
      return;
    }
  }
  else if (aVar2 == cmd_remove_subscriber) {
    pPVar11 = InterfaceInfo::getPublication
                        (&this->interfaceInformation,(InterfaceHandle)(cmd->dest_handle).hid);
    if (pPVar11 != (PublicationInfo *)0x0) {
      subscriberToRemove.fed_id.gid = (cmd->source_id).gid;
      subscriberToRemove.handle.hid = (cmd->source_handle).hid;
      PublicationInfo::removeSubscriber(pPVar11,subscriberToRemove);
      return;
    }
  }
  else if (aVar2 == cmd_add_publisher) {
    pIVar9 = InterfaceInfo::getInput
                       (&this->interfaceInformation,(InterfaceHandle)(cmd->dest_handle).hid);
    if (pIVar9 == (InputInfo *)0x0) {
      pEVar12 = InterfaceInfo::getEndpoint
                          (&this->interfaceInformation,(InterfaceHandle)(cmd->dest_handle).hid);
      if (pEVar12 == (EndpointInfo *)0x0) {
        return;
      }
      pbVar7 = (cmd->payload).heap;
      source.fed_id.gid = (cmd->source_id).gid;
      source.handle.hid = (cmd->source_handle).hid;
      sVar4 = (cmd->payload).bufferSize;
      psVar10 = ActionMessage::getString_abi_cxx11_(cmd,0);
      sourceName_02._M_str = (char *)pbVar7;
      sourceName_02._M_len = sVar4;
      sourceType_00._M_str = (psVar10->_M_dataplus)._M_p;
      sourceType_00._M_len = psVar10->_M_string_length;
      EndpointInfo::addSource(pEVar12,source,sourceName_02,sourceType_00);
    }
    else {
      local_118 = (cmd->payload).heap;
      local_110.fed_id.gid = (cmd->source_id).gid;
      local_110.handle.hid = (cmd->source_handle).hid;
      sVar4 = (cmd->payload).bufferSize;
      psVar10 = ActionMessage::getString_abi_cxx11_(cmd,0);
      pcVar5 = (psVar10->_M_dataplus)._M_p;
      sVar6 = psVar10->_M_string_length;
      psVar10 = ActionMessage::getString_abi_cxx11_(cmd,1);
      pcStack_100 = (psVar10->_M_dataplus)._M_p;
      local_108 = psVar10->_M_string_length;
      sunits._M_str = pcStack_100;
      sunits._M_len = local_108;
      sourceName_00._M_str = (char *)local_118;
      sourceName_00._M_len = sVar4;
      stype._M_str = pcVar5;
      stype._M_len = sVar6;
      bVar8 = InputInfo::addSource(pIVar9,local_110,sourceName_00,stype,sunits);
      if (!bVar8) {
        return;
      }
    }
    if (this->timeMethod == DISTRIBUTED) {
      BVar3 = (cmd->source_id).gid;
      pTVar14 = (this->timeCoord)._M_t.
                super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                ._M_t.
                super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
      UNRECOVERED_JUMPTABLE =
           *(code **)((long)(pTVar14->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator + 0x20);
      goto LAB_002b5405;
    }
  }
  return;
}

Assistant:

void FederateState::processDataConnectionMessage(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_ADD_PUBLISHER: {
            auto* subI = interfaceInformation.getInput(cmd.dest_handle);
            if (subI != nullptr) {
                if (subI->addSource(cmd.getSource(),
                                    cmd.name(),
                                    cmd.getString(typeStringLoc),
                                    cmd.getString(unitStringLoc))) {
                    if (timeMethod == TimeSynchronizationMethod::DISTRIBUTED) {
                        addDependency(cmd.source_id);
                    }
                }
            } else {
                auto* eptI = interfaceInformation.getEndpoint(cmd.dest_handle);
                if (eptI != nullptr) {
                    eptI->addSource(cmd.getSource(), cmd.name(), cmd.getString(typeStringLoc));
                    if (timeMethod == TimeSynchronizationMethod::DISTRIBUTED) {
                        addDependency(cmd.source_id);
                    }
                }
            }
        } break;
        case CMD_ADD_SUBSCRIBER: {
            auto* pubI = interfaceInformation.getPublication(cmd.dest_handle);
            if (pubI != nullptr) {
                if (pubI->addSubscriber(cmd.getSource(), cmd.name())) {
                    if (timeMethod == TimeSynchronizationMethod::DISTRIBUTED) {
                        addDependent(cmd.source_id);
                    }
                }

                if (getState() > FederateStates::CREATED) {
                    if (getState() == FederateStates::EXECUTING &&
                        timeMethod == TimeSynchronizationMethod::DISTRIBUTED) {
                        resetDependency(cmd.source_id);
                        addDependent(cmd.source_id);
                    }
                    if (!pubI->data.empty() && pubI->lastPublishTime > Time::minVal()) {
                        ActionMessage pub(CMD_PUB);
                        pub.setSource(pubI->id);
                        pub.setDestination(cmd.getSource());
                        pub.counter = static_cast<uint16_t>(getCurrentIteration());
                        pub.payload = pubI->data;
                        pub.actionTime = pubI->lastPublishTime;
                        routeMessage(std::move(pub));
                    }
                }
            }
        } break;
        case CMD_ADD_ENDPOINT: {
            auto* eptI = interfaceInformation.getEndpoint(cmd.dest_handle);
            if (eptI != nullptr) {
                if (checkActionFlag(cmd, destination_target)) {
                    eptI->addDestination(cmd.getSource(), cmd.name(), cmd.getString(typeStringLoc));
                    if (eptI->targetedEndpoint) {
                        if (timeMethod == TimeSynchronizationMethod::DISTRIBUTED) {
                            addDependent(cmd.source_id);
                        }
                    }
                } else {
                    eptI->addSource(cmd.getSource(), cmd.name(), cmd.getString(typeStringLoc));
                    if (eptI->targetedEndpoint) {
                        if (timeMethod == TimeSynchronizationMethod::DISTRIBUTED) {
                            addDependency(cmd.source_id);
                            if (getState() == FederateStates::EXECUTING) {
                                minimumReceiveTime = time_granted;
                            }
                        }
                    }
                }
            }
        } break;
        case CMD_REMOVE_NAMED_PUBLICATION: {
            auto* subI = interfaceInformation.getInput(cmd.source_handle);
            if (subI != nullptr) {
                subI->removeSource(std::string(cmd.name()),
                                   (cmd.actionTime != timeZero) ? cmd.actionTime : time_granted);
            }
            break;
        }
        case CMD_REMOVE_PUBLICATION: {
            auto* subI = interfaceInformation.getInput(cmd.dest_handle);
            if (subI != nullptr) {
                subI->removeSource(cmd.getSource(),
                                   (cmd.actionTime != timeZero) ? cmd.actionTime : time_granted);
            }
            break;
        }
        case CMD_REMOVE_SUBSCRIBER: {
            auto* pubI = interfaceInformation.getPublication(cmd.dest_handle);
            if (pubI != nullptr) {
                pubI->removeSubscriber(cmd.getSource());
            }
        } break;
        case CMD_CLOSE_INTERFACE:
            if (cmd.source_id == global_id.load()) {
                closeInterface(cmd.source_handle, static_cast<InterfaceType>(cmd.counter));
            }
            break;

        case CMD_REMOVE_ENDPOINT:
        default:
            break;
    }
}